

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max.h
# Opt level: O0

void __thiscall
mp::
MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,-1>
::
ConvertConvexPart<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>
          (MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,__1>
           *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MinId>
                 *mc)

{
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  const_reference pvVar1;
  FunctionalConstraint *in_RSI;
  LinTerms *in_RDI;
  NodeRange NVar2;
  size_t i;
  int resvar;
  size_t nargs;
  Arguments *args;
  ValueNode *in_stack_fffffffffffffdf0;
  undefined1 fSort;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffffe18;
  NodeIndexRange in_stack_fffffffffffffe20;
  NodeIndexRange rr;
  initializer_list<double> in_stack_fffffffffffffe28;
  value_type local_1c8;
  int local_1c4;
  value_type *local_1c0;
  undefined8 local_1b8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  LinTerms *in_stack_fffffffffffffe60;
  undefined1 local_181;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 *local_170;
  undefined8 local_168;
  ulong local_30;
  int local_24;
  size_type local_20;
  Arguments *local_18;
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  local_18 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
                             *)(in_RSI + 1));
  local_20 = std::vector<int,_std::allocator<int>_>::size(local_18);
  local_24 = FunctionalConstraint::GetResultVar(local_10);
  NVar2.ir_ = in_stack_fffffffffffffe20;
  NVar2.pvn_ = in_stack_fffffffffffffdf0;
  for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
    this_00 = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)in_RDI);
    local_180 = 0xbff0000000000000;
    local_178 = 0x3ff0000000000000;
    local_170 = &local_180;
    local_168 = 2;
    fSort = (undefined1)((ulong)&local_181 >> 0x38);
    std::allocator<double>::allocator((allocator<double> *)0x201359);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)NVar2.ir_,in_stack_fffffffffffffe28,
               (allocator_type *)in_stack_fffffffffffffe18);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_30);
    local_1c8 = *pvVar1;
    local_1c4 = local_24;
    local_1c0 = &local_1c8;
    local_1b8 = 2;
    std::allocator<int>::allocator((allocator<int> *)0x2013c5);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)NVar2.ir_,
               (initializer_list<int>)in_stack_fffffffffffffe28,
               (allocator_type *)in_stack_fffffffffffffe18);
    LinTerms::LinTerms(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
                      );
    AlgConRhs<-1>::AlgConRhs((AlgConRhs<_1> *)&stack0xfffffffffffffe28,0.0);
    rr = NVar2.ir_;
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (in_stack_fffffffffffffe18,in_RDI,(AlgConRhs<_1>)rr,(bool)fSort);
    NVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)rr,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar2.pvn_;
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              (in_stack_fffffffffffffe18);
    LinTerms::~LinTerms((LinTerms *)NVar2.pvn_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::allocator<int>::~allocator((allocator<int> *)0x20148b);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this_00);
    std::allocator<double>::~allocator((allocator<double> *)0x2014a5);
  }
  return;
}

Assistant:

void ConvertConvexPart(const MinOrMaxConstraint& mc) {
    const auto& args = mc.GetArguments();
    const std::size_t nargs = args.size();
    const auto resvar = mc.GetResultVar();
    for (size_t i=0; i<nargs; ++i) {
      GetMC().AddConstraint(LinConLE(
                         { {1.0*sense, -1.0*sense},
                           {args[i], resvar} }, 0.0));
    }
  }